

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O0

void Ccf_ManStop(Ccf_Man_t *p)

{
  Ccf_Man_t *p_local;
  
  Vec_IntFree(p->vCopies);
  Gia_ManUnrollStop(p->pUnr);
  sat_solver_delete(p->pSat);
  Gia_ManStopP(&p->pFrames);
  if (p != (Ccf_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Ccf_ManStop( Ccf_Man_t * p )
{
    Vec_IntFree( p->vCopies );
    Gia_ManUnrollStop( p->pUnr );
    sat_solver_delete( p->pSat );
    Gia_ManStopP( &p->pFrames );
    ABC_FREE( p );
}